

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<double>_>::AddKel
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  Fad<double> *pFVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Fad<double> prevval;
  Fad<double> local_68;
  long local_48;
  long local_40;
  long local_38;
  
  lVar9 = (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_40 = lVar9;
  if (iVar4 == 0) {
    if (0 < lVar9) {
      lVar9 = 0;
      do {
        lVar2 = destinationindex->fStore[lVar9];
        lVar10 = 0;
        local_48 = lVar9;
        do {
          lVar11 = local_48;
          lVar6 = destinationindex->fStore[lVar10];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_68,this,lVar2);
          if (((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
             ((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar10)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar11 = (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * lVar10;
          uVar1 = elmat->fElem[lVar11 + lVar9].dx_.num_elts;
          lVar12 = (long)(int)uVar1;
          pFVar8 = elmat->fElem + lVar11 + lVar9;
          if (lVar12 != 0) {
            pdVar7 = (pFVar8->dx_).ptr_to_data;
            if ((ulong)(uint)local_68.dx_.num_elts == 0) {
              uVar5 = lVar12 * 8;
              if ((int)uVar1 < 0) {
                uVar5 = 0xffffffffffffffff;
              }
              local_68.dx_.num_elts = uVar1;
              local_68.dx_.ptr_to_data = (double *)operator_new__(uVar5);
              if (0 < (int)uVar1) {
                lVar11 = 0;
                do {
                  local_68.dx_.ptr_to_data[lVar11] = pdVar7[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar12 != lVar11);
              }
            }
            else if (0 < local_68.dx_.num_elts) {
              uVar5 = 0;
              do {
                local_68.dx_.ptr_to_data[uVar5] = pdVar7[uVar5] + local_68.dx_.ptr_to_data[uVar5];
                uVar5 = uVar5 + 1;
              } while ((uint)local_68.dx_.num_elts != uVar5);
            }
          }
          local_68.val_ = pFVar8->val_ + local_68.val_;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar2,lVar6,&local_68);
          Fad<double>::~Fad(&local_68);
          lVar10 = lVar10 + 1;
        } while (lVar10 != local_40);
        lVar9 = local_48 + 1;
      } while (lVar9 != local_40);
    }
  }
  else if (0 < lVar9) {
    lVar9 = 0;
    do {
      lVar2 = destinationindex->fStore[lVar9];
      local_48 = lVar9 << 5;
      local_38 = lVar9;
      do {
        lVar6 = local_38;
        lVar10 = destinationindex->fStore[lVar9];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&local_68,this,lVar2)
        ;
        if (((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar6) ||
           ((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar6 = (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * lVar9;
        uVar1 = *(uint *)((long)&elmat->fElem[lVar6].dx_.num_elts + local_48);
        lVar11 = (long)(int)uVar1;
        pdVar7 = (double *)((long)&elmat->fElem[lVar6].val_ + local_48);
        if (lVar11 != 0) {
          dVar3 = pdVar7[2];
          if ((ulong)(uint)local_68.dx_.num_elts == 0) {
            uVar5 = lVar11 * 8;
            if ((int)uVar1 < 0) {
              uVar5 = 0xffffffffffffffff;
            }
            local_68.dx_.num_elts = uVar1;
            local_68.dx_.ptr_to_data = (double *)operator_new__(uVar5);
            if (0 < (int)uVar1) {
              lVar6 = 0;
              do {
                local_68.dx_.ptr_to_data[lVar6] = *(double *)((long)dVar3 + lVar6 * 8);
                lVar6 = lVar6 + 1;
              } while (lVar11 != lVar6);
            }
          }
          else if (0 < local_68.dx_.num_elts) {
            uVar5 = 0;
            do {
              local_68.dx_.ptr_to_data[uVar5] =
                   *(double *)((long)dVar3 + uVar5 * 8) + local_68.dx_.ptr_to_data[uVar5];
              uVar5 = uVar5 + 1;
            } while ((uint)local_68.dx_.num_elts != uVar5);
          }
        }
        local_68.val_ = *pdVar7 + local_68.val_;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar10,&local_68);
        Fad<double>::~Fad(&local_68);
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_40);
      lVar9 = local_38 + 1;
    } while (lVar9 != local_40);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = elmat.Rows();
  	int64_t icoef,jcoef,ieq,jeq;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}